

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.cpp
# Opt level: O0

ostream * operator<<(ostream *output,LinkedList *list)

{
  ostream *poVar1;
  Node *local_20;
  Node *node;
  LinkedList *list_local;
  ostream *output_local;
  
  for (local_20 = list->start; local_20 != (Node *)0x0; local_20 = local_20->next) {
    poVar1 = (ostream *)std::ostream::operator<<(output,local_20->index);
    poVar1 = std::operator<<(poVar1,"> ");
    poVar1 = std::operator<<(poVar1,(string *)&local_20->data);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return output;
}

Assistant:

std::ostream &operator<<(std::ostream &output, LinkedList &list) {

    Node* node = list.start;

    // Print line number followed by the node's string data and end the line
    while (node != nullptr) {
        output << node->index << "> " << node->data << std::endl;

        node = node->next;
    }
    return output;  // chain them together like strings
}